

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bit_count.cpp
# Opt level: O1

void __thiscall BitCount_CountTrailingZeros_Test::TestBody(BitCount_CountTrailingZeros_Test *this)

{
  uint128 x;
  uint128 x_00;
  uint uVar1;
  pointer *__ptr;
  char *pcVar2;
  AssertionResult gtest_ar;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  
  uVar3 = 0x7f;
  x.v_._4_4_ = in_stack_ffffffffffffffcc;
  x.v_._0_4_ = 0x7f;
  x.v_._8_4_ = in_stack_ffffffffffffffd0;
  x.v_._12_4_ = in_stack_ffffffffffffffd4;
  uVar1 = pstore::bit_count::ctz((bit_count *)0x0,x);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_28,"127U","pstore::bit_count::ctz (pstore::uint128{std::uint64_t{1} << 63, 0U})",
             (uint *)&stack0xffffffffffffffc8,(uint *)&stack0xffffffffffffffd0);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar2 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if ((long *)CONCAT44(in_stack_ffffffffffffffcc,uVar3) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffcc,uVar3) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  uVar3 = 0x3f;
  x_00.v_._4_4_ = in_stack_ffffffffffffffcc;
  x_00.v_._0_4_ = 0x3f;
  x_00.v_._8_4_ = uVar1;
  x_00.v_._12_4_ = in_stack_ffffffffffffffd4;
  pstore::bit_count::ctz((bit_count *)&DAT_8000000000000000,x_00);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_28,"63U","pstore::bit_count::ctz (pstore::uint128{0U, std::uint64_t{1} << 63})",
             (uint *)&stack0xffffffffffffffc8,(uint *)&stack0xffffffffffffffd0);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar2 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if ((long *)CONCAT44(in_stack_ffffffffffffffcc,uVar3) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffcc,uVar3) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  uVar1 = 0x3f;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_28,"63U","pstore::bit_count::ctz (std::uint64_t{1} << 63)",
             (uint *)&stack0xffffffffffffffc8,(uint *)&stack0xffffffffffffffd0);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar2 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if ((long *)CONCAT44(in_stack_ffffffffffffffcc,uVar1) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffcc,uVar1) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  uVar1 = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_28,"0U","pstore::bit_count::ctz (std::uint64_t{1})",
             (uint *)&stack0xffffffffffffffc8,(uint *)&stack0xffffffffffffffd0);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar2 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if ((long *)CONCAT44(in_stack_ffffffffffffffcc,uVar1) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffcc,uVar1) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  uVar1 = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_28,"1U","pstore::bit_count::ctz (std::uint64_t{2})",
             (uint *)&stack0xffffffffffffffc8,(uint *)&stack0xffffffffffffffd0);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar2 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if ((long *)CONCAT44(in_stack_ffffffffffffffcc,uVar1) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffcc,uVar1) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  uVar1 = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_28,"0U","pstore::bit_count::ctz (std::numeric_limits<std::uint64_t>::max ())",
             (uint *)&stack0xffffffffffffffc8,(uint *)&stack0xffffffffffffffd0);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffc8);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_d47bc + 0x50;
    }
    else {
      pcVar2 = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_bit_count.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&stack0xffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
    if ((long *)CONCAT44(in_stack_ffffffffffffffcc,uVar1) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(in_stack_ffffffffffffffcc,uVar1) + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  return;
}

Assistant:

TEST (BitCount, CountTrailingZeros) {
    EXPECT_EQ (127U, pstore::bit_count::ctz (pstore::uint128{std::uint64_t{1} << 63, 0U}));
    EXPECT_EQ (63U, pstore::bit_count::ctz (pstore::uint128{0U, std::uint64_t{1} << 63}));

    EXPECT_EQ (63U, pstore::bit_count::ctz (std::uint64_t{1} << 63));
    EXPECT_EQ (0U, pstore::bit_count::ctz (std::uint64_t{1}));
    EXPECT_EQ (1U, pstore::bit_count::ctz (std::uint64_t{2}));
    EXPECT_EQ (0U, pstore::bit_count::ctz (std::numeric_limits<std::uint64_t>::max ()));
}